

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O3

bool is_exact_name(char *str,char *namelist)

{
  bool bVar1;
  bool bVar2;
  char name [4608];
  char local_1228 [4616];
  
  if (namelist == (char *)0x0) {
    bVar2 = false;
  }
  else {
    do {
      namelist = one_argument(namelist,local_1228);
      bVar2 = local_1228[0] != '\0';
      if (local_1228[0] == '\0') {
        return bVar2;
      }
      bVar1 = str_cmp(str,local_1228);
    } while (bVar1);
  }
  return bVar2;
}

Assistant:

bool is_exact_name(char *str, char *namelist)
{
	char name[MAX_INPUT_LENGTH];

	if (namelist == nullptr)
		return false;

	for (;;)
	{
		namelist = one_argument(namelist, name);

		if (name[0] == '\0')
			return false;
		if (!str_cmp(str, name))
			return true;
	}
}